

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void encode_segmentation(AV1_COMMON *cm,aom_write_bit_buffer *wb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  segmentation *seg_00;
  SEG_LVL_FEATURES feature_id;
  aom_write_bit_buffer *in_RSI;
  long in_RDI;
  int data;
  int ubits;
  int data_min;
  int data_max;
  int active;
  segmentation *seg;
  int j;
  int i;
  int in_stack_ffffffffffffffc8;
  int local_18;
  int local_14;
  
  seg_00 = (segmentation *)(in_RDI + 19000);
  aom_wb_write_bit(in_RSI,(uint)seg_00->enabled);
  if (seg_00->enabled != '\0') {
    if (*(int *)(in_RDI + 0x1fc) != 7) {
      aom_wb_write_bit(in_RSI,(uint)*(byte *)(in_RDI + 0x4a39));
      if (*(char *)(in_RDI + 0x4a39) != '\0') {
        aom_wb_write_bit(in_RSI,(uint)*(byte *)(in_RDI + 0x4a3b));
      }
      aom_wb_write_bit(in_RSI,(uint)*(byte *)(in_RDI + 0x4a3a));
    }
    if (*(char *)(in_RDI + 0x4a3a) != '\0') {
      for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
        for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
          feature_id = (SEG_LVL_FEATURES)local_18;
          iVar1 = segfeature_active(seg_00,(uint8_t)local_14,feature_id);
          aom_wb_write_bit(in_RSI,iVar1);
          if (iVar1 != 0) {
            iVar2 = av1_seg_feature_data_max(feature_id);
            iVar1 = -iVar2;
            iVar3 = get_unsigned_bits(0);
            iVar4 = get_segdata(seg_00,local_14,feature_id);
            iVar2 = clamp(iVar4,iVar1,iVar2);
            iVar4 = av1_is_segfeature_signed(feature_id);
            if (iVar4 == 0) {
              aom_wb_write_literal
                        ((aom_write_bit_buffer *)CONCAT44(iVar1,iVar3),iVar2,
                         in_stack_ffffffffffffffc8);
            }
            else {
              aom_wb_write_inv_signed_literal
                        ((aom_write_bit_buffer *)CONCAT44(iVar1,iVar3),iVar2,
                         in_stack_ffffffffffffffc8);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void encode_segmentation(AV1_COMMON *cm,
                                       struct aom_write_bit_buffer *wb) {
  int i, j;
  struct segmentation *seg = &cm->seg;

  aom_wb_write_bit(wb, seg->enabled);
  if (!seg->enabled) return;

  // Write update flags
  if (cm->features.primary_ref_frame != PRIMARY_REF_NONE) {
    aom_wb_write_bit(wb, seg->update_map);
    if (seg->update_map) aom_wb_write_bit(wb, seg->temporal_update);
    aom_wb_write_bit(wb, seg->update_data);
  }

  // Segmentation data
  if (seg->update_data) {
    for (i = 0; i < MAX_SEGMENTS; i++) {
      for (j = 0; j < SEG_LVL_MAX; j++) {
        const int active = segfeature_active(seg, i, j);
        aom_wb_write_bit(wb, active);
        if (active) {
          const int data_max = av1_seg_feature_data_max(j);
          const int data_min = -data_max;
          const int ubits = get_unsigned_bits(data_max);
          const int data = clamp(get_segdata(seg, i, j), data_min, data_max);

          if (av1_is_segfeature_signed(j)) {
            aom_wb_write_inv_signed_literal(wb, data, ubits);
          } else {
            aom_wb_write_literal(wb, data, ubits);
          }
        }
      }
    }
  }
}